

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::FrontFacingCase::iterate(FrontFacingCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  RGBA RVar7;
  TestLog *log_00;
  RenderContext *pRVar8;
  deUint32 extraout_var;
  RenderTarget *pRVar9;
  PixelFormat *this_00;
  TestError *this_01;
  char *description;
  int iStack_3e8;
  bool isOk;
  int x_1;
  int local_3dc;
  int x;
  int y;
  PrimitiveList local_3b0;
  PrimitiveList local_398;
  allocator<char> local_379;
  string local_378;
  undefined1 local_358 [8];
  VertexArrayBinding posBinding;
  deUint16 indicesCW [6];
  deUint16 indicesCCW [6];
  float positions [16];
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  ProgramSources local_230;
  undefined1 local_160 [8];
  ShaderProgram program;
  Surface refImg;
  Surface testImg;
  RGBA local_58;
  RGBA local_54;
  int local_50;
  RGBA threshold;
  int viewportY;
  int viewportX;
  int height;
  undefined1 local_30 [4];
  int width;
  Random rnd;
  Functions *gl;
  TestLog *log;
  FrontFacingCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar8->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  de::Random::Random((Random *)local_30,0x89f2c);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar9);
  iVar3 = de::min<int>(0x40,iVar3);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getHeight(pRVar9);
  iVar4 = de::min<int>(0x40,iVar4);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getWidth(pRVar9);
  threshold.m_value = de::Random::getInt((Random *)local_30,0,iVar5 - iVar3);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getHeight(pRVar9);
  local_50 = de::Random::getInt((Random *)local_30,0,iVar5 - iVar4);
  tcu::RGBA::RGBA(&local_58,1,1,1,1);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  this_00 = tcu::RenderTarget::getPixelFormat(pRVar9);
  testImg.m_pixels.m_cap._4_4_ = tcu::PixelFormat::getColorThreshold(this_00);
  local_54 = tcu::operator+(&local_58,(RGBA *)((long)&testImg.m_pixels.m_cap + 4));
  tcu::Surface::Surface((Surface *)&refImg.m_pixels.m_cap,iVar3,iVar4);
  tcu::Surface::Surface((Surface *)&program.m_program.m_info.linkTimeUs,iVar3,iVar4);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\tif (gl_FrontFacing)\n\t\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\to_color = vec4(0.0, 0.0, 1.0, 1.0);\n}\n"
             ,&local_279);
  glu::makeVtxFragSources(&local_230,&local_250,&local_278);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_160,pRVar8,&local_230);
  glu::ProgramSources::~ProgramSources(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  glu::operator<<(log_00,(ShaderProgram *)local_160);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_160);
  if (!bVar2) {
    positions[0xf]._2_1_ = 1;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Compile failed",(allocator<char> *)((long)positions + 0x3f));
    tcu::TestError::TestError(this_01,&local_2a0);
    positions[0xf]._2_1_ = 0;
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  positions[10] = 1.0;
  positions[0xb] = -1.0;
  positions[0xc] = 0.0;
  positions[0xd] = 1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[8] = 0.0;
  positions[9] = 1.0;
  positions[2] = -1.0;
  positions[3] = -1.0;
  positions[4] = 0.0;
  positions[5] = 1.0;
  stack0xfffffffffffffd18 = 0x3f800000bf800000;
  positions[0] = 0.0;
  positions[1] = 1.0;
  stack0xfffffffffffffd08 = 0x2000200010000;
  indicesCCW[0] = 1;
  indicesCCW[1] = 3;
  posBinding.pointer.data = (void *)0x3000000010002;
  indicesCW[0] = 1;
  indicesCW[1] = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"a_position",&local_379);
  glu::va::Float((VertexArrayBinding *)local_358,&local_378,4,4,0,(float *)(indicesCCW + 4));
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pcVar1 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  (*pcVar1)(dVar6);
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(threshold.m_value,local_50,iVar3 / 2,iVar4);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles(&local_398,6,indicesCW + 4);
  glu::draw(pRVar8,dVar6,1,(VertexArrayBinding *)local_358,&local_398,(DrawUtilCallback *)0x0);
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))
            (threshold.m_value + iVar3 / 2,local_50,iVar3 - iVar3 / 2,iVar4);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_160);
  glu::pr::Triangles(&local_3b0,6,(deUint16 *)&posBinding.pointer.data);
  glu::draw(pRVar8,dVar6,1,(VertexArrayBinding *)local_358,&local_3b0,(DrawUtilCallback *)0x0);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  RVar7 = threshold;
  iVar3 = local_50;
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&refImg.m_pixels.m_cap);
  glu::readPixels(pRVar8,RVar7.m_value,iVar3,(PixelBufferAccess *)&x);
  dVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar6,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x29a);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_358);
  local_3dc = 0;
  while( true ) {
    iVar3 = tcu::Surface::getHeight((Surface *)&program.m_program.m_info.linkTimeUs);
    if (iVar3 <= local_3dc) break;
    x_1 = 0;
    while( true ) {
      iVar3 = tcu::Surface::getWidth((Surface *)&program.m_program.m_info.linkTimeUs);
      if (iVar3 / 2 <= x_1) break;
      RVar7 = tcu::RGBA::green();
      tcu::Surface::setPixel((Surface *)&program.m_program.m_info.linkTimeUs,x_1,local_3dc,RVar7);
      x_1 = x_1 + 1;
    }
    iStack_3e8 = tcu::Surface::getWidth((Surface *)&program.m_program.m_info.linkTimeUs);
    iStack_3e8 = iStack_3e8 / 2;
    while( true ) {
      iVar3 = tcu::Surface::getWidth((Surface *)&program.m_program.m_info.linkTimeUs);
      if (iVar3 <= iStack_3e8) break;
      RVar7 = tcu::RGBA::blue();
      tcu::Surface::setPixel
                ((Surface *)&program.m_program.m_info.linkTimeUs,iStack_3e8,local_3dc,RVar7);
      iStack_3e8 = iStack_3e8 + 1;
    }
    local_3dc = local_3dc + 1;
  }
  bVar2 = tcu::pixelThresholdCompare
                    (log_00,"Result","Image comparison result",
                     (Surface *)&program.m_program.m_info.linkTimeUs,
                     (Surface *)&refImg.m_pixels.m_cap,&local_54,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_160);
  tcu::Surface::~Surface((Surface *)&program.m_program.m_info.linkTimeUs);
  tcu::Surface::~Surface((Surface *)&refImg.m_pixels.m_cap);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		// Test case renders two adjecent quads, where left is has front-facing
		// triagles and right back-facing. Color is selected based on gl_FrontFacing
		// value.

		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(0x89f2c);
		const int				width		= de::min(64, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(64, m_context.getRenderTarget().getHeight());
		const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
		const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_FrontFacing)\n"
			"		o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		o_color = vec4(0.0, 0.0, 1.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-1.0f,  1.0f, 0.0f, 1.0f,
				-1.0f, -1.0f, 0.0f, 1.0f,
				 1.0f,  1.0f, 0.0f, 1.0f,
				 1.0f, -1.0f, 0.0f, 1.0f
			};
			const deUint16 indicesCCW[]	= { 0, 1, 2, 2, 1, 3 };
			const deUint16 indicesCW[]	= { 2, 1, 0, 3, 1, 2 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			gl.viewport(viewportX, viewportY, width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCCW), &indicesCCW[0]));

			gl.viewport(viewportX + width/2, viewportY, width-width/2, height);
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indicesCW), &indicesCW[0]));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth()/2; x++)
				refImg.setPixel(x, y, tcu::RGBA::green());

			for (int x = refImg.getWidth()/2; x < refImg.getWidth(); x++)
				refImg.setPixel(x, y, tcu::RGBA::blue());
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}